

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall naive_trie::insert(naive_trie *this,char *key,size_t len,int32_t value)

{
  _Rb_tree_header *p_Var1;
  undefined1 uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_char,_naive_trie>_>,_bool> pVar5;
  pair<char,_naive_trie> local_98;
  _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
  local_58;
  uint local_28;
  undefined4 uStack_24;
  
  if (len != 0) {
    do {
      local_98.first = *key;
      p_Var4 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 == (_Base_ptr)0x0) {
LAB_0021eb7d:
        local_58._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_58._M_impl.super__Rb_tree_header._M_header;
        local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_28 = local_28 & 0xffffff00;
        uStack_24 = 0;
        local_98.second.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_98.second.children._M_t._M_impl.super__Rb_tree_header._M_header;
        local_98.second.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_98.second.children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_98.second.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_98.second._48_8_ = ZEXT48(local_28);
        local_98.second.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_98.second.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_58._M_impl.super__Rb_tree_header._M_header._M_right =
             local_58._M_impl.super__Rb_tree_header._M_header._M_left;
        pVar5 = std::
                _Rb_tree<char,std::pair<char_const,naive_trie>,std::_Select1st<std::pair<char_const,naive_trie>>,std::less<char>,std::allocator<std::pair<char_const,naive_trie>>>
                ::_M_emplace_unique<std::pair<char,naive_trie>>
                          ((_Rb_tree<char,std::pair<char_const,naive_trie>,std::_Select1st<std::pair<char_const,naive_trie>>,std::less<char>,std::allocator<std::pair<char_const,naive_trie>>>
                            *)this,&local_98);
        llama_vocab::std::
        _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
        ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
                     *)&local_98.second);
        llama_vocab::std::
        _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
        ::~_Rb_tree(&local_58);
        insert((naive_trie *)&pVar5.first._M_node._M_node[1]._M_parent,key + 1,len - 1,value);
        return;
      }
      p_Var1 = &(this->children)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = &p_Var1->_M_header;
      do {
        uVar2 = (undefined1)p_Var4[1]._M_color;
        if (local_98.first <= (char)uVar2) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[(char)uVar2 < local_98.first];
      } while (p_Var4 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var3 == p_Var1) || (local_98.first < (char)p_Var3[1]._M_color))
      goto LAB_0021eb7d;
      this = (naive_trie *)&p_Var3[1]._M_parent;
      key = key + 1;
      len = len - 1;
    } while (len != 0);
  }
  this->has_value = true;
  this->value = value;
  return;
}

Assistant:

void insert(const char * key, size_t len, int32_t value = 0) {
        if (len == 0) {
            this->has_value = true;
            this->value = value;
            return;
        }
        char c = key[0];
        auto res = children.find(c);
        if (res != children.end()) {
            res->second.insert(key + 1, len - 1, value);
        } else {
            auto res = children.insert(std::make_pair(c, naive_trie()));
            res.first->second.insert(key + 1, len - 1, value);
        }
    }